

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

string * __thiscall
ast::InitStmt::toString_abi_cxx11_(string *__return_storage_ptr__,InitStmt *this)

{
  ostream *poVar1;
  ostringstream msg;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,"init ");
  operator<<((ostream *)local_190,this->variable);
  std::operator<<((ostream *)local_190," = ");
  poVar1 = operator<<((ostream *)local_190,this->value);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string ast::InitStmt::toString() const
{
    std::ostringstream msg;
    msg << "init ";
    msg << variable;
    msg << " = ";
    msg << value << std::endl;
    return msg.str();
}